

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_class
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  mapped_type *this_00;
  Atom *this_01;
  string label;
  Class _p;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> _Stack_188;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_178;
  key_type local_168;
  Class local_148;
  Class local_100;
  Reference local_b8;
  
  bVar1 = std::operator!=(&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->label,"");
  if (!bVar1) {
    return false;
  }
  std::__cxx11::string::substr
            ((ulong)&local_168,
             (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->label);
  Class::Class(&local_148,ANY);
  std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_178,&node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = object(this,(Ptr *)&local_178,&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  if (!bVar1) {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_188,
               &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = marker(this,(Ptr *)&_Stack_188,&local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_188._M_refcount);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_00135a7c;
    }
  }
  Class::Class(&local_100,ANY);
  Reference::Reference(&local_b8,(ulong)write_index,&local_148,&local_100);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->local_references,&local_168);
  Reference::operator=(this_00,&local_b8);
  Reference::~Reference(&local_b8);
  Class::~Class(&local_100);
  bVar1 = true;
  if (write) {
    this_01 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(this_01,&local_148.atom);
  }
LAB_00135a7c:
  Class::~Class(&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  return bVar1;
}

Assistant:

bool Compiler::read_class(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL.
{
    if (node->label != "") {
        std::string label = node->label.substr(0, node->label.size() - 1);
        Class _p;

        if (!object(node, _p)) {
            if (!marker(node, _p)) {
                return false;
            }
        }

        local_references[label] = Reference(write_index, _p, Class());

        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    return false;
}